

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_mesh.cpp
# Opt level: O0

bool __thiscall ON_Mesh::Compact(ON_Mesh *this)

{
  uint uVar1;
  uint uVar2;
  uint uVar3;
  int iVar4;
  ON_TextureCoordinates *pOVar5;
  int local_20;
  int local_1c;
  int i_1;
  int i;
  uint meshFcount;
  uint meshVcount;
  ON_Mesh *this_local;
  
  uVar1 = ON_SimpleArray<ON_3fPoint>::UnsignedCount(&(this->m_V).super_ON_SimpleArray<ON_3fPoint>);
  uVar2 = ON_SimpleArray<ON_MeshFace>::UnsignedCount(&this->m_F);
  uVar3 = ON_SimpleArray<ON_3fVector>::UnsignedCount
                    (&(this->m_FN).super_ON_SimpleArray<ON_3fVector>);
  if (uVar3 != uVar2) {
    ON_SimpleArray<ON_3fVector>::Destroy(&(this->m_FN).super_ON_SimpleArray<ON_3fVector>);
  }
  uVar2 = ON_SimpleArray<ON_3fVector>::UnsignedCount(&(this->m_N).super_ON_SimpleArray<ON_3fVector>)
  ;
  if (uVar2 != uVar1) {
    ON_SimpleArray<ON_3fVector>::Destroy(&(this->m_N).super_ON_SimpleArray<ON_3fVector>);
  }
  uVar2 = ON_SimpleArray<ON_2fPoint>::UnsignedCount(&(this->m_T).super_ON_SimpleArray<ON_2fPoint>);
  if (uVar2 != uVar1) {
    ON_SimpleArray<ON_2fPoint>::Destroy(&(this->m_T).super_ON_SimpleArray<ON_2fPoint>);
  }
  local_1c = ON_ClassArray<ON_TextureCoordinates>::Count(&this->m_TC);
  while (local_1c = local_1c + -1, -1 < local_1c) {
    pOVar5 = ON_ClassArray<ON_TextureCoordinates>::operator[](&this->m_TC,local_1c);
    uVar2 = ON_SimpleArray<ON_3fPoint>::UnsignedCount(&pOVar5->m_T);
    if (uVar2 != uVar1) {
      ON_ClassArray<ON_TextureCoordinates>::Remove(&this->m_TC,local_1c);
    }
  }
  uVar2 = ON_SimpleArray<ON_2dPoint>::UnsignedCount(&(this->m_S).super_ON_SimpleArray<ON_2dPoint>);
  if (uVar2 != uVar1) {
    ON_SimpleArray<ON_2dPoint>::Destroy(&(this->m_S).super_ON_SimpleArray<ON_2dPoint>);
  }
  uVar2 = ON_SimpleArray<ON_SurfaceCurvature>::UnsignedCount(&this->m_K);
  if (uVar2 != uVar1) {
    ON_SimpleArray<ON_SurfaceCurvature>::Destroy(&this->m_K);
  }
  uVar2 = ON_SimpleArray<ON_Color>::UnsignedCount(&this->m_C);
  if (uVar2 != uVar1) {
    ON_SimpleArray<ON_Color>::Destroy(&this->m_C);
  }
  uVar2 = ON_SimpleArray<bool>::UnsignedCount(&this->m_H);
  if (uVar2 != uVar1) {
    ON_SimpleArray<bool>::Destroy(&this->m_H);
  }
  CullUnusedVertices(this);
  ON_SimpleArray<ON_3fPoint>::Shrink(&(this->m_V).super_ON_SimpleArray<ON_3fPoint>);
  ON_SimpleArray<ON_MeshFace>::Shrink(&this->m_F);
  ON_SimpleArray<ON_3fVector>::Shrink(&(this->m_N).super_ON_SimpleArray<ON_3fVector>);
  ON_SimpleArray<ON_3fVector>::Shrink(&(this->m_FN).super_ON_SimpleArray<ON_3fVector>);
  ON_SimpleArray<ON_SurfaceCurvature>::Shrink(&this->m_K);
  ON_SimpleArray<ON_Color>::Shrink(&this->m_C);
  ON_SimpleArray<ON_2dPoint>::Shrink(&(this->m_S).super_ON_SimpleArray<ON_2dPoint>);
  ON_SimpleArray<ON_2fPoint>::Shrink(&(this->m_T).super_ON_SimpleArray<ON_2fPoint>);
  for (local_20 = 0; iVar4 = ON_ClassArray<ON_TextureCoordinates>::Count(&this->m_TC),
      local_20 < iVar4; local_20 = local_20 + 1) {
    pOVar5 = ON_ClassArray<ON_TextureCoordinates>::operator[](&this->m_TC,local_20);
    ON_SimpleArray<ON_3fPoint>::Shrink(&pOVar5->m_T);
  }
  return true;
}

Assistant:

bool ON_Mesh::Compact()
{
  unsigned int meshVcount = m_V.UnsignedCount();
  unsigned int meshFcount = m_F.UnsignedCount();

  if (m_FN.UnsignedCount() != meshFcount)
    m_FN.Destroy();

  if (m_N.UnsignedCount() != meshVcount)
    m_N.Destroy();

  if (m_T.UnsignedCount() != meshVcount)
    m_T.Destroy();

  for (int i = m_TC.Count() - 1; i >= 0; i--)
  {
    if (m_TC[i].m_T.UnsignedCount() != meshVcount)
      m_TC.Remove(i);
  }

  if (m_S.UnsignedCount() != meshVcount)
    m_S.Destroy();

  if (m_K.UnsignedCount() != meshVcount)
    m_K.Destroy();

  if (m_C.UnsignedCount() != meshVcount)
    m_C.Destroy();

  if (m_H.UnsignedCount() != meshVcount)
    m_H.Destroy();

  CullUnusedVertices();

  m_V.Shrink();
  m_F.Shrink();
  m_N.Shrink();
  m_FN.Shrink();
  m_K.Shrink();
  m_C.Shrink();
  m_S.Shrink();
  m_T.Shrink();

  for (int i = 0; i < m_TC.Count(); i++)
    m_TC[i].m_T.Shrink();

  return true;
}